

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall SMBusSimulationDataGenerator::OutputStart(SMBusSimulationDataGenerator *this)

{
  int iVar1;
  
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    AdvanceAllBySec(this,4.9999999999999996e-06);
    SimulationChannelDescriptor::Transition();
  }
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    AdvanceAllBySec(this,4.7e-06);
    SimulationChannelDescriptor::Transition();
  }
  AdvanceAllBySec(this,9.999999999999999e-06);
  SimulationChannelDescriptor::Transition();
  AdvanceAllBySec(this,9.999999999999999e-06);
  SimulationChannelDescriptor::Transition();
  AdvanceAllBySec(this,9.4e-06);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputStart()
{
    // get SMBDAT high
    if( mSMBDAT->GetCurrentBitState() == BIT_LOW )
    {
        AdvanceAllBySec( ONE_US * 5 );
        mSMBDAT->Transition();
    }

    // get SMBCLK high
    if( mSMBCLK->GetCurrentBitState() == BIT_LOW )
    {
        AdvanceAllBySec( TSU_STA_MIN );
        mSMBCLK->Transition();
    }

    // SMBDAT goes low
    AdvanceAllBySec( ONE_US * 10 );
    mSMBDAT->Transition();

    // SMBCLK goes low
    AdvanceAllBySec( ONE_US * 10 );
    mSMBCLK->Transition();

    // pause a little
    AdvanceAllBySec( TBUF_MIN * 2 );
}